

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isWellFormedAddress(XMLCh *addrString,MemoryManager *manager)

{
  ulong length;
  short *psVar1;
  XMLCh XVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  XMLSize_t toSearchLen;
  ulong uVar9;
  XMLCh *targetStr;
  
  if ((addrString != (XMLCh *)0x0) && (XVar2 = *addrString, XVar2 != L'\0')) {
    lVar6 = 2;
    do {
      psVar1 = (short *)((long)addrString + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar1 != 0);
    if (1 < (ushort)XVar2 - 0x2d) {
      uVar7 = lVar6 >> 1;
      length = uVar7 - 1;
      if (XVar2 == L'[') {
        bVar3 = isWellFormedIPv6Reference(addrString,length);
        return bVar3;
      }
      if (addrString[uVar7 - 2] != L'-') {
        lVar6 = 0;
        do {
          psVar1 = (short *)((long)addrString + lVar6);
          lVar6 = lVar6 + 2;
        } while (*psVar1 != 0);
        iVar4 = XMLString::lastIndexOf(L'.',addrString,(lVar6 >> 1) - 1);
        if (length == (long)(iVar4 + 1)) {
          iVar5 = (*manager->_vptr_MemoryManager[3])(manager,length * 2);
          targetStr = (XMLCh *)CONCAT44(extraout_var,iVar5);
          toSearchLen = 0;
          XMLString::subString(targetStr,addrString,0,(long)iVar4,manager);
          if (targetStr != (XMLCh *)0x0) {
            lVar6 = 0;
            do {
              psVar1 = (short *)((long)targetStr + lVar6);
              lVar6 = lVar6 + 2;
            } while (*psVar1 != 0);
            toSearchLen = (lVar6 >> 1) - 1;
          }
          iVar4 = XMLString::lastIndexOf(L'.',targetStr,toSearchLen);
          (*manager->_vptr_MemoryManager[4])(manager,targetStr);
          lVar6 = (long)iVar4;
          bVar3 = XMLString::isDigit(addrString[lVar6 + 1]);
          if (bVar3) {
            return false;
          }
        }
        else {
          lVar6 = (long)iVar4;
        }
        bVar3 = XMLString::isDigit(addrString[lVar6 + 1]);
        if (bVar3) {
          bVar3 = isWellFormedIPv4Address(addrString,length);
          return bVar3;
        }
        if (length < 0x100) {
          if (length != 0) {
            uVar8 = 0;
            uVar9 = 1;
            do {
              if (addrString[uVar9 - 1] == L'.') {
                if ((uVar9 != 1) && (bVar3 = XMLString::isAlphaNum(addrString[uVar9 - 2]), !bVar3))
                {
                  return false;
                }
                uVar8 = 0;
                if (uVar9 < length) {
                  bVar3 = XMLString::isAlphaNum(addrString[uVar9]);
                  uVar8 = 0;
                  if (!bVar3) {
                    return false;
                  }
                }
              }
              else {
                bVar3 = XMLString::isAlphaNum(addrString[uVar9 - 1]);
                if (bVar3) {
                  uVar8 = uVar8 + 1;
                  if (0x3f < uVar8) {
                    return false;
                  }
                }
                else {
                  if (addrString[uVar9 - 1] != L'-') {
                    return false;
                  }
                  uVar8 = uVar8 + 1;
                  if (0x3f < uVar8) {
                    return false;
                  }
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool XMLUri::isWellFormedAddress(const XMLCh* const addrString
                                 , MemoryManager* const manager)
{
    // Check that we have a non-zero length string.
    if (!addrString || !*addrString)
        return false;

    // Get address length.
    XMLSize_t addrStrLen = XMLString::stringLen(addrString);

    // Check if the host is a valid IPv6reference.
    if (*addrString == chOpenSquare)
    {
        return isWellFormedIPv6Reference(addrString, addrStrLen);
    }

    //
    // Cannot start with a '.', '-', or end with a '-'.
    //
    if (*addrString == chPeriod ||
        *addrString == chDash ||
        addrString[addrStrLen-1] == chDash)
        return false;

    // rightmost domain label starting with digit indicates IP address
    // since top level domain label can only start with an alpha
    // see RFC 2396 Section 3.2.2

    int lastPeriodPos = XMLString::lastIndexOf(addrString, chPeriod);

    // if the string ends with "."
    // get the second last "."
    if (XMLSize_t(lastPeriodPos + 1) == addrStrLen)
    {
        XMLCh* tmp2 = (XMLCh*) manager->allocate
        (
            addrStrLen * sizeof(XMLCh)
        );//new XMLCh[addrStrLen];
        XMLString::subString(tmp2, addrString, 0, lastPeriodPos, manager);
        lastPeriodPos = XMLString::lastIndexOf(tmp2, chPeriod);
        manager->deallocate(tmp2);//delete [] tmp2;

        if ( XMLString::isDigit(addrString[lastPeriodPos + 1]))
			return false;
    }

    if (XMLString::isDigit(addrString[lastPeriodPos + 1]))
    {
        return isWellFormedIPv4Address(addrString, addrStrLen);
    } // end of IPv4address
    else
    {
        //
        //  hostname      = *( domainlabel "." ) toplabel [ "." ]
        //  domainlabel   = alphanum | alphanum *( alphanum | "-" ) alphanum
        //  toplabel      = alpha | alpha *( alphanum | "-" ) alphanum

        // RFC 2396 states that hostnames take the form described in
        // RFC 1034 (Section 3) and RFC 1123 (Section 2.1). According
        // to RFC 1034, hostnames are limited to 255 characters.
        if (addrStrLen > 255) {
            return false;
        }

        unsigned int labelCharCount = 0;

        // domain labels can contain alphanumerics and '-"
        // but must start and end with an alphanumeric
        for (XMLSize_t i = 0; i < addrStrLen; i++)
        {
            if (addrString[i] == chPeriod)
            {
              if (((i > 0)  &&
                   (!XMLString::isAlphaNum(addrString[i-1]))) ||
                  ((i + 1 < addrStrLen) &&
                   (!XMLString::isAlphaNum(addrString[i+1])))  )
                {
                    return false;
                }
                labelCharCount = 0;
            }
            else if (!XMLString::isAlphaNum(addrString[i]) &&
                      addrString[i] != chDash)
            {
                return false;
            }
            // RFC 1034: Labels must be 63 characters or less.
            else if (++labelCharCount > 63) {
                return false;
            }
        } //for
    }

    return true;
}